

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

void dumpTypeName(raw_ostream *OS,DWARFDie *D)

{
  DWARFDebugInfoEntry **this;
  DWARFDie DVar1;
  DWARFDie DVar2;
  DWARFDie DVar3;
  undefined1 auVar4 [16];
  DWARFDie DVar5;
  DWARFDie DVar6;
  Tag TVar7;
  char *pcVar8;
  size_t sVar9;
  DWARFAbbreviationDeclaration *pDVar10;
  uint *puVar11;
  OptionalStorage<unsigned_int,_true> OVar12;
  ulong uVar13;
  raw_ostream *prVar14;
  byte bVar15;
  uint uVar16;
  char *in_RCX;
  undefined7 uVar17;
  DWARFDebugInfoEntry *extraout_RDX;
  DWARFDebugInfoEntry *extraout_RDX_00;
  ulong uVar18;
  DWARFDebugInfoEntry *pDVar19;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_01;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_02;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_03;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_04;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_05;
  DWARFUnit *pDVar20;
  void *__buf;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 extraout_RDX_06;
  DWARFDebugInfoEntry *extraout_RDX_07;
  DWARFDebugInfoEntry *extraout_RDX_08;
  DWARFDebugInfoEntry *pDVar21;
  DWARFDebugInfoEntry *extraout_RDX_09;
  int iVar22;
  ulong uVar23;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar24;
  DWARFUnit *pDVar25;
  uint uVar26;
  bool bVar27;
  StringRef SVar28;
  DWARFDie DVar29;
  Optional<unsigned_long> OVar30;
  DWARFDie DVar31;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  DWARFDie local_d8;
  undefined1 local_c8 [8];
  DWARFDie TypeDie;
  Optional<llvm::DWARFFormValue> L;
  uint local_74;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_70;
  DWARFDie local_68;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_58;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  DWARFUnit *local_38;
  
  if (D->U == (DWARFUnit *)0x0) {
    return;
  }
  if (D->Die == (DWARFDebugInfoEntry *)0x0) {
    return;
  }
  pcVar8 = llvm::DWARFDie::getName(D,LinkageName);
  if (pcVar8 != (char *)0x0) {
    sVar9 = strlen(pcVar8);
    SVar28.Length = sVar9;
    SVar28.Data = pcVar8;
    llvm::raw_ostream::operator<<(OS,SVar28);
    return;
  }
  pDVar10 = llvm::DWARFDie::getAbbreviationDeclarationPtr(D);
  if (pDVar10 == (DWARFAbbreviationDeclaration *)0x0) {
    TVar7 = DW_TAG_null;
  }
  else {
    TVar7 = pDVar10->Tag;
  }
  uVar26 = (uint)TVar7;
  if (((0x33 < TVar7 - 0xf) ||
      (in_RCX = (char *)0x8000000010043,
      (0x8000000010043U >> ((ulong)(TVar7 - 0xf) & 0x3f) & 1) == 0)) && (uVar26 != 1)) {
    SVar28 = llvm::dwarf::TagString(uVar26);
    uVar13 = SVar28.Length;
    puVar11 = (uint *)SVar28.Data;
    if (((6 < uVar13) &&
        (in_RCX = (char *)(ulong)(*puVar11 ^ 0x545f5744),
        *(int *)((long)puVar11 + 3) == 0x5f474154 && (*puVar11 ^ 0x545f5744) == 0)) &&
       (uVar16 = *(uint *)((long)puVar11 + (uVar13 - 5)) ^ 0x7079745f,
       in_RCX = (char *)(ulong)uVar16, *(char *)((long)puVar11 + (uVar13 - 1)) == 'e' && uVar16 == 0
       )) {
      uVar23 = 7;
      if (uVar13 < 7) {
        uVar23 = uVar13;
      }
      uVar18 = uVar13 - uVar23;
      if (uVar13 - 0xc <= uVar13 - uVar23) {
        uVar18 = uVar13 - 0xc;
      }
      Str_00.Length = uVar18;
      Str_00.Data = (char *)((long)puVar11 + uVar23);
      prVar14 = llvm::raw_ostream::operator<<(OS,Str_00);
      in_RCX = prVar14->OutBufCur;
      if (prVar14->OutBufEnd == in_RCX) {
        llvm::raw_ostream::write(prVar14,0xe60352,(void *)0x1,(size_t)in_RCX);
      }
      else {
        *in_RCX = ' ';
        prVar14->OutBufCur = prVar14->OutBufCur + 1;
      }
    }
  }
  _local_c8 = llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_type);
  dumpTypeName(OS,(DWARFDie *)local_c8);
  DVar31.Die = extraout_RDX;
  DVar31.U = local_38;
  if (TVar7 < DW_TAG_subroutine_type) {
    if (uVar26 == 1) {
      if (D->Die == (DWARFDebugInfoEntry *)0x0 || D->U == (DWARFUnit *)0x0) {
        local_68 = (DWARFDie)ZEXT816(0);
      }
      else {
        local_68 = llvm::DWARFUnit::getFirstChild(D->U,D->Die);
      }
      if (D->Die == (DWARFDebugInfoEntry *)0x0 || D->U == (DWARFUnit *)0x0) {
        DVar29 = (DWARFDie)ZEXT816(0);
      }
      else {
        DVar29 = llvm::DWARFUnit::getLastChild(D->U,D->Die);
      }
      DVar2 = DVar29;
      if (local_68 == DVar29) {
        return;
      }
      do {
        local_38 = (DWARFUnit *)DVar2.Die;
        L.Storage._48_8_ = DVar2.U;
        if ((local_68.U == (DWARFUnit *)0x0) || (local_68.Die == (DWARFDebugInfoEntry *)0x0)) {
LAB_00d87451:
          local_38 = (DWARFUnit *)DVar2.Die;
          __assert_fail("isValid() && \"must check validity prior to calling\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                        ,0x3b,
                        "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                       );
        }
        pDVar10 = (local_68.Die)->AbbrevDecl;
        if ((pDVar10 != (DWARFAbbreviationDeclaration *)0x0) &&
           (pDVar10->Tag == DW_TAG_subrange_type)) {
          this = &TypeDie.Die;
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_68,DW_AT_lower_bound);
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar30 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            local_50 = OVar30.Storage.field_0;
            local_44 = OVar30.Storage._8_4_;
          }
          else {
            local_50.value = local_50.value & 0xffffffffffffff00;
            local_44 = 0;
          }
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_68,DW_AT_count);
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar30 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            local_58 = OVar30.Storage.field_0;
            local_40 = OVar30.Storage._8_4_;
          }
          else {
            local_58.value = local_58.value & 0xffffffffffffff00;
            local_40 = 0;
          }
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_68,DW_AT_upper_bound);
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar30 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            local_70 = OVar30.Storage.field_0;
            local_3c = OVar30.Storage._8_4_;
          }
          else {
            local_70.value = local_70.value & 0xffffffffffffff00;
            local_3c = 0;
          }
          pDVar20 = D->U;
          llvm::DWARFUnit::extractDIEsIfNeeded(pDVar20,true);
          local_d8.Die = (pDVar20->DieArray).
                         super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          OVar12.field_0 = (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)0x0;
          OVar12.hasVal = false;
          OVar12._5_3_ = 0;
          local_d8.U = pDVar20;
          if ((DWARFUnit *)local_d8.Die ==
              (DWARFUnit *)
              (pDVar20->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_d8.Die = (DWARFDebugInfoEntry *)(DWARFUnit *)0x0;
            local_d8.U = (DWARFUnit *)0x0;
          }
          llvm::DWARFDie::find((Optional<llvm::DWARFFormValue> *)this,&local_d8,DW_AT_language);
          uVar13 = 0;
          aVar24 = extraout_RDX_01;
          uVar26 = local_44;
          if (L.Storage.field_0._40_1_ == '\x01') {
            OVar30 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)this);
            uVar26 = local_44;
            if (((undefined1  [16])OVar30.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            {
              OVar12.field_0 =
                   (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)0x0;
              OVar12.hasVal = false;
              OVar12._5_3_ = 0;
              uVar13 = 0;
              aVar24.value = OVar30.Storage._8_8_;
            }
            else {
              OVar12 = (OptionalStorage<unsigned_int,_true>)
                       llvm::dwarf::LanguageLowerBound(OVar30.Storage.field_0._0_4_);
              local_74 = OVar12._1_4_ & 0xffffff;
              uVar13 = (ulong)OVar12 >> 0x20;
              aVar24 = extraout_RDX_02;
              if (((ulong)OVar12 >> 0x20 & 1) != 0) {
                bVar27 = ((byte)uVar26 &
                         (void *)local_50.value == (void *)((ulong)OVar12 & 0xffffffff)) != 0;
                if (bVar27) {
                  local_50.value = 0;
                }
                aVar24 = local_50;
                uVar26 = uVar26 & 0xff;
                if (bVar27) {
                  uVar26 = 0;
                }
              }
            }
          }
          if ((uVar26 & 1) == 0) {
            bVar15 = (byte)local_40 | (byte)local_3c;
            if ((bVar15 & 1) == 0) {
              pcVar8 = OS->OutBufCur;
              sVar9 = (long)OS->OutBufEnd - (long)pcVar8;
              if (1 < sVar9) {
                pcVar8[0] = '[';
                pcVar8[1] = ']';
                goto LAB_00d87150;
              }
              iVar22 = 0xe87362;
              goto LAB_00d87144;
            }
            if ((uVar13 & 1) == 0) {
              pcVar8 = OS->OutBufCur;
              sVar9 = (long)OS->OutBufEnd - (long)pcVar8;
              if (sVar9 < 2) {
                llvm::raw_ostream::write(OS,0xe7d5f8,(void *)0x2,sVar9);
                aVar24 = extraout_RDX_05;
              }
              else {
                pcVar8[0] = '[';
                pcVar8[1] = '[';
                OS->OutBufCur = OS->OutBufCur + 2;
              }
              pcVar8 = OS->OutBufCur;
              if (pcVar8 < OS->OutBufEnd) {
                OS->OutBufCur = pcVar8 + 1;
                *pcVar8 = '?';
              }
              else {
                llvm::raw_ostream::write(OS,0x3f,(void *)aVar24,sVar9);
                aVar24 = extraout_RDX_06;
              }
              goto LAB_00d87009;
            }
            pcVar8 = OS->OutBufCur;
            if (pcVar8 < OS->OutBufEnd) {
              OS->OutBufCur = pcVar8 + 1;
              *pcVar8 = '[';
              prVar14 = OS;
            }
            else {
              prVar14 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  (OS,0x5b,(void *)aVar24,
                                   (ulong)CONCAT31((int3)(local_40 >> 8),bVar15));
            }
            aVar24 = local_58;
            if ((local_40 & 1) == 0) {
              if ((local_3c & 1) == 0) {
                __assert_fail("hasVal",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                              ,0xad,
                              "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                             );
              }
              aVar24.value = (local_70.value - ((ulong)(local_74 << 8) | (ulong)OVar12 & 0xff)) + 1;
            }
            prVar14 = llvm::raw_ostream::operator<<(prVar14,aVar24.value);
            pcVar8 = prVar14->OutBufCur;
            if (pcVar8 < prVar14->OutBufEnd) {
              prVar14->OutBufCur = pcVar8 + 1;
              *pcVar8 = ']';
            }
            else {
              llvm::raw_ostream::write(prVar14,0x5d,__buf,(size_t)pcVar8);
            }
          }
          else {
            pcVar8 = OS->OutBufCur;
            sVar9 = (long)OS->OutBufEnd - (long)pcVar8;
            if (sVar9 < 2) {
              llvm::raw_ostream::write(OS,0xe7d5f8,(void *)0x2,sVar9);
            }
            else {
              pcVar8[0] = '[';
              pcVar8[1] = '[';
              OS->OutBufCur = OS->OutBufCur + 2;
            }
            llvm::raw_ostream::operator<<(OS,local_50.value);
            aVar24 = extraout_RDX_03;
LAB_00d87009:
            pcVar8 = OS->OutBufCur;
            sVar9 = (long)OS->OutBufEnd - (long)pcVar8;
            if (sVar9 < 2) {
              llvm::raw_ostream::write(OS,0xe57e2b,(void *)0x2,sVar9);
              aVar24 = extraout_RDX_04;
            }
            else {
              pcVar8[0] = ',';
              pcVar8[1] = ' ';
              OS->OutBufCur = OS->OutBufCur + 2;
            }
            prVar14 = OS;
            if ((local_40 & 1) == 0) {
              if ((local_3c & 1) != 0) {
                aVar24.value = local_70.value + 1;
                goto LAB_00d8711f;
              }
              pcVar8 = OS->OutBufCur;
              if (pcVar8 < OS->OutBufEnd) {
                OS->OutBufCur = pcVar8 + 1;
                *pcVar8 = '?';
              }
              else {
                llvm::raw_ostream::write(OS,0x3f,(void *)aVar24,sVar9);
              }
            }
            else {
              if ((uVar26 & 1) == 0) {
                sVar9 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
                if (sVar9 < 4) {
                  prVar14 = (raw_ostream *)llvm::raw_ostream::write(OS,0xe7d5fb,(void *)0x4,sVar9);
                  aVar24 = local_58;
                }
                else {
                  builtin_strncpy(OS->OutBufCur,"? + ",4);
                  OS->OutBufCur = OS->OutBufCur + 4;
                  aVar24 = local_58;
                }
              }
              else {
                aVar24.value = local_50.value + local_58.value;
              }
LAB_00d8711f:
              llvm::raw_ostream::operator<<(prVar14,aVar24.value);
            }
            pcVar8 = OS->OutBufCur;
            sVar9 = (long)OS->OutBufEnd - (long)pcVar8;
            if (sVar9 < 2) {
              iVar22 = 0xe77215;
LAB_00d87144:
              llvm::raw_ostream::write(OS,iVar22,(void *)0x2,sVar9);
            }
            else {
              pcVar8[0] = ')';
              pcVar8[1] = ']';
LAB_00d87150:
              OS->OutBufCur = OS->OutBufCur + 2;
            }
          }
          DVar29.Die = (DWARFDebugInfoEntry *)local_38;
          DVar29.U = (DWARFUnit *)L.Storage._48_8_;
        }
        pDVar20 = (DWARFUnit *)DVar29.Die;
        pDVar25 = DVar29.U;
        if (local_68.Die == (DWARFDebugInfoEntry *)0x0 || local_68.U == (DWARFUnit *)0x0) {
          local_68 = (DWARFDie)ZEXT816(0);
        }
        else {
          local_68 = llvm::DWARFUnit::getSibling(local_68.U,local_68.Die);
          pDVar20 = local_38;
        }
        DVar2.Die = (DWARFDebugInfoEntry *)local_38;
        DVar2.U = (DWARFUnit *)L.Storage._48_8_;
        DVar1.Die = (DWARFDebugInfoEntry *)pDVar20;
        DVar1.U = pDVar25;
        DVar29.Die = (DWARFDebugInfoEntry *)pDVar20;
        DVar29.U = pDVar25;
        if (local_68 == DVar1) {
          return;
        }
      } while( true );
    }
    pDVar19 = extraout_RDX;
    if (uVar26 != 0xf) {
      if (uVar26 != 0x10) {
        return;
      }
      pcVar8 = OS->OutBufCur;
      if (pcVar8 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar8 + 1;
        *pcVar8 = '&';
        return;
      }
      iVar22 = 0x26;
      goto LAB_00d87421;
    }
  }
  else {
    if (TVar7 == DW_TAG_rvalue_reference_type) {
      Str_01.Length = 2;
      Str_01.Data = "&&";
      llvm::raw_ostream::operator<<(OS,Str_01);
      return;
    }
    if (uVar26 != 0x1f) {
      if (uVar26 != 0x15) {
        return;
      }
      if ((local_c8 == (undefined1  [8])0x0) ||
         (pDVar19 = extraout_RDX, TypeDie.U == (DWARFUnit *)0x0)) {
        Str.Length = 4;
        Str.Data = "void";
        llvm::raw_ostream::operator<<(OS,Str);
        pDVar19 = extraout_RDX_00;
      }
      pcVar8 = OS->OutBufCur;
      if (pcVar8 < OS->OutBufEnd) {
        in_RCX = pcVar8 + 1;
        OS->OutBufCur = in_RCX;
        *pcVar8 = '(';
      }
      else {
        llvm::raw_ostream::write(OS,0x28,pDVar19,(size_t)in_RCX);
        pDVar19 = extraout_RDX_07;
      }
      uVar17 = (undefined7)((ulong)in_RCX >> 8);
      if (D->Die == (DWARFDebugInfoEntry *)0x0 || D->U == (DWARFUnit *)0x0) {
        unique0x100004c4 = (DWARFDie)ZEXT816(0);
      }
      else {
        join_0x00000010_0x00000000_ = llvm::DWARFUnit::getFirstChild(D->U,D->Die);
        pDVar19 = TypeDie._16_8_;
      }
      pDVar20 = D->U;
      pDVar21 = D->Die;
      in_RCX = (char *)CONCAT71(uVar17,pDVar21 != (DWARFDebugInfoEntry *)0x0 &&
                                       pDVar20 != (DWARFUnit *)0x0);
      if (pDVar21 != (DWARFDebugInfoEntry *)0x0 && pDVar20 != (DWARFUnit *)0x0) {
        DVar31 = llvm::DWARFUnit::getLastChild(pDVar20,pDVar21);
        pDVar19 = DVar31.Die;
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pDVar19;
        DVar31 = (DWARFDie)(auVar4 << 0x40);
        pDVar19 = (DWARFDebugInfoEntry *)0x0;
      }
      local_38 = DVar31.U;
      DVar5.Die = pDVar19;
      DVar5.U = local_38;
      if (unique0x100004b4 != DVar5) {
        bVar27 = true;
        do {
          pDVar21 = DVar31.Die;
          local_38 = DVar31.U;
          DVar3.Die = (DWARFDebugInfoEntry *)local_38;
          DVar3.U = (DWARFUnit *)L.Storage._48_8_;
          DVar2.Die = (DWARFDebugInfoEntry *)local_38;
          DVar2.U = (DWARFUnit *)L.Storage._48_8_;
          if ((TypeDie._16_8_ == (DWARFDebugInfoEntry *)0x0) ||
             (DVar2 = DVar3, TypeDie.Die == (DWARFUnit *)0x0)) goto LAB_00d87451;
          pDVar10 = (TypeDie._16_8_)->AbbrevDecl;
          if ((pDVar10 != (DWARFAbbreviationDeclaration *)0x0) &&
             (pDVar10->Tag == DW_TAG_formal_parameter)) {
            if (!bVar27) {
              Str_02.Length = 2;
              Str_02.Data = ", ";
              llvm::raw_ostream::operator<<(OS,Str_02);
            }
            local_68 = llvm::DWARFDie::getAttributeValueAsReferencedDie
                                 ((DWARFDie *)&TypeDie.Die,DW_AT_type);
            dumpTypeName(OS,&local_68);
            bVar27 = false;
            pDVar21 = extraout_RDX_08;
          }
          in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),
                                    L.Storage.field_0._0_8_ != 0 &&
                                    TypeDie.Die != (DWARFDebugInfoEntry *)0x0);
          if (L.Storage.field_0._0_8_ != 0 && TypeDie.Die != (DWARFDebugInfoEntry *)0x0) {
            join_0x00000010_0x00000000_ =
                 llvm::DWARFUnit::getSibling
                           ((DWARFUnit *)TypeDie.Die,(DWARFDebugInfoEntry *)L.Storage.field_0._0_8_)
            ;
            pDVar21 = TypeDie._16_8_;
          }
          else {
            unique0x10000572 = (DWARFDie)ZEXT816(0);
          }
          DVar6.Die = pDVar19;
          DVar6.U = local_38;
          DVar31.Die = pDVar21;
          DVar31.U = local_38;
        } while (unique0x10000562 != DVar6);
      }
      pcVar8 = OS->OutBufCur;
      if (pcVar8 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar8 + 1;
        *pcVar8 = ')';
        return;
      }
      iVar22 = 0x29;
      goto LAB_00d87421;
    }
    join_0x00000010_0x00000000_ =
         llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_containing_type);
    pDVar19 = TypeDie._16_8_;
    bVar27 = TypeDie.Die != (DWARFUnit *)0x0;
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),
                              pDVar19 != (DWARFDebugInfoEntry *)0x0 && bVar27);
    if (pDVar19 != (DWARFDebugInfoEntry *)0x0 && bVar27) {
      pcVar8 = OS->OutBufCur;
      if (pcVar8 < OS->OutBufEnd) {
        in_RCX = pcVar8 + 1;
        OS->OutBufCur = in_RCX;
        *pcVar8 = ' ';
        prVar14 = OS;
      }
      else {
        prVar14 = (raw_ostream *)llvm::raw_ostream::write(OS,0x20,pDVar19,(size_t)in_RCX);
      }
      dumpTypeName(prVar14,(DWARFDie *)&TypeDie.Die);
      Str_03.Length = 2;
      Str_03.Data = "::";
      llvm::raw_ostream::operator<<(OS,Str_03);
      pDVar19 = extraout_RDX_09;
    }
  }
  DVar31.Die = pDVar19;
  DVar31.U = local_38;
  pcVar8 = OS->OutBufCur;
  if (pcVar8 < OS->OutBufEnd) {
    OS->OutBufCur = pcVar8 + 1;
    *pcVar8 = '*';
    return;
  }
  iVar22 = 0x2a;
LAB_00d87421:
  local_38 = DVar31.U;
  llvm::raw_ostream::write(OS,iVar22,DVar31.Die,(size_t)in_RCX);
  return;
}

Assistant:

static void dumpTypeName(raw_ostream &OS, const DWARFDie &D) {
  if (!D.isValid())
    return;

  if (const char *Name = D.getName(DINameKind::LinkageName)) {
    OS << Name;
    return;
  }

  // FIXME: We should have pretty printers per language. Currently we print
  // everything as if it was C++ and fall back to the TAG type name.
  const dwarf::Tag T = D.getTag();
  switch (T) {
  case DW_TAG_array_type:
  case DW_TAG_pointer_type:
  case DW_TAG_ptr_to_member_type:
  case DW_TAG_reference_type:
  case DW_TAG_rvalue_reference_type:
  case DW_TAG_subroutine_type:
    break;
  default:
    dumpTypeTagName(OS, T);
  }

  // Follow the DW_AT_type if possible.
  DWARFDie TypeDie = D.getAttributeValueAsReferencedDie(DW_AT_type);
  dumpTypeName(OS, TypeDie);

  switch (T) {
  case DW_TAG_subroutine_type: {
    if (!TypeDie)
      OS << "void";
    OS << '(';
    bool First = true;
    for (const DWARFDie &C : D.children()) {
      if (C.getTag() == DW_TAG_formal_parameter) {
        if (!First)
          OS << ", ";
        First = false;
        dumpTypeName(OS, C.getAttributeValueAsReferencedDie(DW_AT_type));
      }
    }
    OS << ')';
    break;
  }
  case DW_TAG_array_type: {
    dumpArrayType(OS, D);
    break;
  }
  case DW_TAG_pointer_type:
    OS << '*';
    break;
  case DW_TAG_ptr_to_member_type:
    if (DWARFDie Cont =
            D.getAttributeValueAsReferencedDie(DW_AT_containing_type)) {
      dumpTypeName(OS << ' ', Cont);
      OS << "::";
    }
    OS << '*';
    break;
  case DW_TAG_reference_type:
    OS << '&';
    break;
  case DW_TAG_rvalue_reference_type:
    OS << "&&";
    break;
  default:
    break;
  }
}